

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * tinyusdz::print_typed_attr<tinyusdz::Extent>
                   (string *__return_storage_ptr__,
                   TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_> *attr,string *name,
                   uint32_t indent)

{
  Extent v;
  bool bVar1;
  AttrMeta *pAVar2;
  ostream *poVar3;
  value_type *pvVar4;
  TypedTimeSamples<tinyusdz::Extent> *v_00;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *this;
  size_type sVar5;
  const_reference v_01;
  float indent_00;
  ulong uVar6;
  undefined7 uVar7;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t uVar8;
  uint32_t n;
  uint32_t extraout_EDX_01;
  uint32_t n_00;
  bool local_373;
  bool local_372;
  bool local_371;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *paths;
  string local_338;
  string local_318;
  string local_2f8 [32];
  string local_2d8;
  string local_2b8;
  string local_298;
  float local_278 [2];
  float local_270 [4];
  undefined1 local_260 [8];
  Extent a;
  string local_228;
  optional<tinyusdz::Animatable<tinyusdz::Extent>_> local_208;
  optional<tinyusdz::Animatable<tinyusdz::Extent>_> *local_1c0;
  optional<tinyusdz::Animatable<tinyusdz::Extent>_> *pv;
  stringstream local_1b0 [3];
  bool is_timesamples;
  bool has_timesamples;
  bool has_default;
  bool is_connection;
  bool is_value_empty;
  stringstream ss;
  ostream aoStack_1a0 [380];
  uint32_t local_24;
  string *psStack_20;
  uint32_t indent_local;
  string *name_local;
  TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_> *attr_local;
  
  uVar6 = (ulong)indent;
  local_24 = indent;
  psStack_20 = name;
  name_local = (string *)attr;
  attr_local = (TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_> *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1b0);
  bVar1 = TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_>::authored
                    ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_> *)name_local);
  if (bVar1) {
    pv._7_1_ = TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_>::is_value_empty
                         ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_> *)name_local);
    pv._6_1_ = TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_>::is_connection
                         ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_> *)name_local);
    pv._5_1_ = 0;
    pv._4_1_ = 0;
    pv._3_1_ = 0;
    TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_>::get_value
              (&local_208,(TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_> *)name_local);
    local_1c0 = &local_208;
    bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_1c0);
    uVar7 = (undefined7)(uVar6 >> 8);
    local_371 = false;
    if (bVar1) {
      pvVar4 = nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::Extent>_>::value
                         (local_1c0);
      local_371 = Animatable<tinyusdz::Extent>::has_default(pvVar4);
    }
    pv._5_1_ = local_371;
    bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_1c0);
    local_372 = false;
    if (bVar1) {
      pvVar4 = nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::Extent>_>::value
                         (local_1c0);
      local_372 = Animatable<tinyusdz::Extent>::has_timesamples(pvVar4);
    }
    pv._4_1_ = local_372;
    bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_1c0);
    indent_00 = (float)CONCAT71(uVar7,bVar1);
    local_373 = false;
    if (bVar1) {
      pvVar4 = nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::Extent>_>::value
                         (local_1c0);
      local_373 = Animatable<tinyusdz::Extent>::is_timesamples(pvVar4);
    }
    pv._3_1_ = local_373;
    pAVar2 = TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_>::metas
                       ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_> *)name_local);
    bVar1 = AttrMetas::authored(pAVar2);
    uVar8 = extraout_EDX;
    if ((((bVar1) ||
         (bVar1 = TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_>::is_blocked
                            ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_> *)name_local),
         uVar8 = extraout_EDX_00, bVar1)) || ((pv._5_1_ & 1) != 0)) ||
       (((pv._7_1_ & 1) != 0 || (((pv._6_1_ & 1) == 0 && ((pv._3_1_ & 1) == 0)))))) {
      pprint::Indent_abi_cxx11_(&local_228,(pprint *)(ulong)local_24,uVar8);
      ::std::operator<<(aoStack_1a0,(string *)&local_228);
      ::std::__cxx11::string::~string((string *)&local_228);
      value::TypeTraits<tinyusdz::Extent>::type_name_abi_cxx11_();
      poVar3 = ::std::operator<<(aoStack_1a0,(string *)(a.upper._M_elems + 1));
      poVar3 = ::std::operator<<(poVar3," ");
      ::std::operator<<(poVar3,(string *)psStack_20);
      ::std::__cxx11::string::~string((string *)(a.upper._M_elems + 1));
      bVar1 = TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_>::is_blocked
                        ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_> *)name_local);
      if (bVar1) {
        ::std::operator<<(aoStack_1a0," = None");
      }
      else if ((pv._5_1_ & 1) != 0) {
        Extent::Extent((Extent *)local_260);
        pvVar4 = nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::Extent>_>::value
                           (local_1c0);
        bVar1 = Animatable<tinyusdz::Extent>::get_scalar(pvVar4,(Extent *)local_260);
        if (bVar1) {
          poVar3 = ::std::operator<<(aoStack_1a0," = ");
          local_278[0] = (float)local_260._0_4_;
          local_278[1] = (float)local_260._4_4_;
          local_270[0] = a.lower._M_elems[0];
          local_270[1] = a.lower._M_elems[1];
          local_270[2] = a.lower._M_elems[2];
          local_270[3] = a.upper._M_elems[0];
          v.lower._M_elems[2] = a.lower._M_elems[0];
          v.upper._M_elems[0] = a.lower._M_elems[1];
          v.lower._M_elems[0] = (float)local_260._0_4_;
          v.lower._M_elems[1] = (float)local_260._4_4_;
          v.upper._M_elems[1] = a.lower._M_elems[2];
          v.upper._M_elems[2] = a.upper._M_elems[0];
          ::std::operator<<(poVar3,v);
          indent_00 = a.lower._M_elems[0];
        }
        else {
          ::std::operator<<(aoStack_1a0," = [InternalError]");
        }
      }
      pAVar2 = TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_>::metas
                         ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_> *)name_local);
      bVar1 = AttrMetas::authored(pAVar2);
      if (bVar1) {
        poVar3 = ::std::operator<<(aoStack_1a0,"(\n");
        pAVar2 = TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_>::metas
                           ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_> *)name_local);
        print_attr_metas_abi_cxx11_
                  (&local_298,(tinyusdz *)pAVar2,(AttrMeta *)(ulong)(local_24 + 1),
                   (uint32_t)indent_00);
        poVar3 = ::std::operator<<(poVar3,(string *)&local_298);
        pprint::Indent_abi_cxx11_(&local_2b8,(pprint *)(ulong)local_24,n);
        poVar3 = ::std::operator<<(poVar3,(string *)&local_2b8);
        ::std::operator<<(poVar3,")");
        ::std::__cxx11::string::~string((string *)&local_2b8);
        ::std::__cxx11::string::~string((string *)&local_298);
      }
      ::std::operator<<(aoStack_1a0,"\n");
      uVar8 = extraout_EDX_01;
    }
    if ((pv._4_1_ & 1) != 0) {
      pprint::Indent_abi_cxx11_(&local_2d8,(pprint *)(ulong)local_24,uVar8);
      ::std::operator<<(aoStack_1a0,(string *)&local_2d8);
      ::std::__cxx11::string::~string((string *)&local_2d8);
      value::TypeTraits<tinyusdz::Extent>::type_name_abi_cxx11_();
      poVar3 = ::std::operator<<(aoStack_1a0,local_2f8);
      poVar3 = ::std::operator<<(poVar3," ");
      ::std::operator<<(poVar3,(string *)psStack_20);
      ::std::__cxx11::string::~string(local_2f8);
      poVar3 = ::std::operator<<(aoStack_1a0,".timeSamples = ");
      pvVar4 = nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::Extent>_>::value
                         (local_1c0);
      v_00 = Animatable<tinyusdz::Extent>::get_timesamples(pvVar4);
      print_typed_timesamples<tinyusdz::Extent>(&local_318,v_00,local_24);
      ::std::operator<<(poVar3,(string *)&local_318);
      ::std::__cxx11::string::~string((string *)&local_318);
      ::std::operator<<(aoStack_1a0,"\n");
    }
    bVar1 = TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_>::has_connections
                      ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_> *)name_local);
    if (bVar1) {
      pprint::Indent_abi_cxx11_(&local_338,(pprint *)(ulong)local_24,n_00);
      ::std::operator<<(aoStack_1a0,(string *)&local_338);
      ::std::__cxx11::string::~string((string *)&local_338);
      value::TypeTraits<tinyusdz::Extent>::type_name_abi_cxx11_();
      poVar3 = ::std::operator<<(aoStack_1a0,(string *)&paths);
      poVar3 = ::std::operator<<(poVar3," ");
      ::std::operator<<(poVar3,(string *)psStack_20);
      ::std::__cxx11::string::~string((string *)&paths);
      ::std::operator<<(aoStack_1a0,".connect = ");
      this = TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_>::get_connections
                       ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_> *)name_local);
      sVar5 = ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size(this);
      if (sVar5 == 1) {
        v_01 = ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator[](this,0);
        ::std::operator<<(aoStack_1a0,v_01);
      }
      else {
        sVar5 = ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size(this);
        if (sVar5 == 0) {
          ::std::operator<<(aoStack_1a0,"[InternalError]");
        }
        else {
          ::std::operator<<(aoStack_1a0,this);
        }
      }
      ::std::operator<<(aoStack_1a0,"\n");
    }
    nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::Extent>_>::~optional(&local_208);
  }
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string print_typed_attr(const TypedAttribute<Animatable<T>> &attr,
                             const std::string &name, const uint32_t indent) {
  std::stringstream ss;

  if (attr.authored()) {

    bool is_value_empty = attr.is_value_empty();
    bool is_connection = attr.is_connection();
    bool has_default{false};
    bool has_timesamples{false};
    bool is_timesamples{false};
    const auto &pv = attr.get_value();

    has_default = (pv && pv.value().has_default());
    has_timesamples = (pv && pv.value().has_timesamples());
    is_timesamples = (pv && pv.value().is_timesamples());

    DCOUT("name " << name);
    DCOUT("is_value_empty " << is_value_empty);
    DCOUT("is_connection " << is_connection);
    DCOUT("is_timesamples " << is_timesamples);
    DCOUT("has_timesamples " << has_timesamples);
    DCOUT("has_default " << has_default);

    //
    // Emit default value(includes ValueBlock and empty definition) and metada
    //
    // float a METADATA
    // float a = None METADATA
    // float a = 1.5 METADATA
    // 
    // Also emit this line if the attribute contains metadata
    // Do not emit when Attribute is connection only or timesamples only.
    if (attr.metas().authored() || attr.is_blocked() || has_default || is_value_empty || ((!is_connection) && (!is_timesamples))) {

      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;

      if (attr.is_blocked()) {
        ss << " = None";
      } else if (has_default) {
        T a;
        if (pv.value().get_scalar(&a)) {
          ss << " = " << a;
        } else {
          ss << " = [InternalError]";
        }
      } else { // is_value_empty
      }

      if (attr.metas().authored()) {
        ss << "(\n"
           << print_attr_metas(attr.metas(), indent + 1) << pprint::Indent(indent)
           << ")";
      }
      ss << "\n";
    }

    // timesamples
    if (has_timesamples) {
      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;
      ss << ".timeSamples = "
         << print_typed_timesamples(pv.value().get_timesamples(), indent);
      ss << "\n";
    }

    // connection
    if (attr.has_connections()) {

      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;

      ss << ".connect = ";
      const std::vector<Path> &paths = attr.get_connections();
      if (paths.size() == 1) {
        ss << paths[0];
      } else if (paths.size() == 0) {
        ss << "[InternalError]";
      } else {
        ss << paths;
      }
      ss << "\n";
    }

  }

  return ss.str();
}